

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avi_rw.cpp
# Opt level: O0

void read_rec(FILE *file,uint32_t bytes,AVIMaker *aviMaker)

{
  bool bVar1;
  int x;
  Chunk chunk;
  uint32_t node;
  AVIMaker *aviMaker_local;
  FILE *pFStack_10;
  uint32_t bytes_local;
  FILE *file_local;
  
  unique0x1000010e = aviMaker;
  aviMaker_local._4_4_ = bytes;
  pFStack_10 = file;
  Chunk::Chunk((Chunk *)&stack0xffffffffffffffd4);
  while (aviMaker_local._4_4_ != 0) {
    chunk.ckID = read_node(pFStack_10,(uint32_t *)((long)&aviMaker_local + 4));
    bVar1 = read_data(pFStack_10,chunk.ckID,(uint32_t *)((long)&aviMaker_local + 4),
                      stack0xffffffffffffffe0);
    if (!bVar1) {
      if (chunk.ckID == 0x4b4e554a) {
        read_chunk(pFStack_10,(Chunk *)&stack0xffffffffffffffd4,0x4b4e554a,
                   (uint32_t *)((long)&aviMaker_local + 4));
        skip(pFStack_10,x,(uint32_t *)((long)&aviMaker_local + 4));
      }
      else if (chunk.ckID == 0x74646576) {
        read_chunk(pFStack_10,(Chunk *)&stack0xffffffffffffffd4,0x74646576,
                   (uint32_t *)((long)&aviMaker_local + 4));
        skip(pFStack_10,x,(uint32_t *)((long)&aviMaker_local + 4));
      }
    }
  }
  return;
}

Assistant:

void read_rec(FILE *file, uint32_t bytes, AVIMaker *aviMaker) {
    uint32_t node;
    Chunk chunk;
    while (bytes > 0) {
        node = read_node(file, bytes);
        if (read_data(file, node, bytes, aviMaker)) continue;
        switch (node) {
            case VEDT:
                //bytes -= CHUNK_SIZE;
                read_chunk(file, chunk, node, bytes);
                //TRACE print_chunk(chunk);
                skip(file, chunk.ckSize, bytes);
                //bytes -= chunk.ckSize;
                break;
            case JUNK:
                //bytes -= CHUNK_SIZE;
                read_chunk(file, chunk, node, bytes);
                //TRACE print_chunk(chunk);
                skip(file, chunk.ckSize, bytes);
                //bytes -= chunk.ckSize;
                break;
            default:
                int x;
                //std::cin >> x;
                //TRACE printf("unknow fourcc rec - ");
                //TRACE print_fourcc(node);
                //TRACE printf("- 0x%x\n", node);
                break;
        };
        //printf("bytes: %d\n", bytes);
        //std::cin >> x;
    }
}